

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_1190bb6::Target::DumpCommandFragment
          (Value *__return_storage_ptr__,Target *this,
          JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *frag,string *role)

{
  Value *pVVar1;
  ArrayIndex extraout_EDX;
  ArrayIndex extraout_EDX_00;
  JBTIndex bt;
  Value VStack_48;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&VStack_48,(String *)this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"fragment");
  Json::Value::operator=(pVVar1,&VStack_48);
  Json::Value::~Value(&VStack_48);
  bt.Index = extraout_EDX;
  if ((frag->Value)._M_string_length != 0) {
    Json::Value::Value(&VStack_48,&frag->Value);
    pVVar1 = Json::Value::operator[](__return_storage_ptr__,"role");
    Json::Value::operator=(pVVar1,&VStack_48);
    Json::Value::~Value(&VStack_48);
    bt.Index = extraout_EDX_00;
  }
  AddBacktrace((Target *)__return_storage_ptr__,(Value *)(ulong)*(uint *)&(this->TopSource).field_2,
               bt);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpCommandFragment(JBT<std::string> const& frag,
                                        std::string const& role)
{
  Json::Value fragment = Json::objectValue;
  fragment["fragment"] = frag.Value;
  if (!role.empty()) {
    fragment["role"] = role;
  }
  this->AddBacktrace(fragment, frag.Backtrace);
  return fragment;
}